

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManage.cpp
# Opt level: O3

void init_module_manager(void)

{
  ModuleStruct *pMVar1;
  
  pMVar1 = (ModuleStruct *)operator_new(0x30);
  module_head = pMVar1;
  pMVar1->id = 0xff;
  pMVar1->funclist = (LibFuncList *)0x0;
  pMVar1->forward = (ModuleStruct *)0x0;
  pMVar1->name = (char *)0x0;
  pMVar1->ds_seg = 0;
  pMVar1->cs_seg = 0;
  pMVar1->next = (ModuleStruct *)0x0;
  return;
}

Assistant:

void init_module_manager() {
	module_head = new ModuleStruct;
	module_head->id = -1;
	module_head->name = nullptr;
	module_head->cs_seg = 0;
	module_head->ds_seg = 0;
	module_head->forward = nullptr;
	module_head->next = nullptr;
	module_head->funclist = nullptr;
}